

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          BasicProblem<mp::BasicProblemParams<int>_> *this,size_t nvars,double lb,double ub,
          Type type)

{
  size_t sVar1;
  Variable VVar2;
  allocator_type local_39;
  double local_38;
  double local_30;
  
  local_38 = lb;
  local_30 = ub;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,nvars,&local_39);
  if (nvars != 0) {
    sVar1 = 0;
    do {
      VVar2 = AddVar(this,local_38,local_30,type);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start[sVar1] =
           VVar2.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
           index_;
      sVar1 = sVar1 + 1;
    } while (nvars != sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> AddVars(std::size_t nvars,
                           double lb=-INFINITY, double ub=INFINITY,
                           var::Type type = var::CONTINUOUS) {
    std::vector<int> newVars(nvars);
    for (std::size_t  i=0; i<nvars; ++i)
      newVars[i] = AddVar(lb, ub, type).index();
    return newVars;
  }